

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uchar *str;
  uint uVar5;
  uint uVar6;
  
  bVar1 = *in_text;
  uVar3 = (uint)bVar1;
  iVar2 = 1;
  if (-1 < (char)bVar1) goto LAB_001761d8;
  if ((uVar3 & 0xffffffe0) == 0xc0) {
    *out_char = 0xfffd;
    if (in_text_end != (char *)0x0 && (long)in_text_end - (long)in_text < 2) {
      return 1;
    }
    iVar2 = 2;
    if ((byte)*in_text < 0xc2) {
      return 2;
    }
    if (((byte)in_text[1] & 0xffffffc0) != 0x80) {
      return 2;
    }
    uVar3 = (byte)in_text[1] & 0x3f | ((byte)*in_text & 0x1f) << 6;
    goto LAB_001761d8;
  }
  if ((bVar1 & 0xf0) == 0xe0) {
    *out_char = 0xfffd;
    if (in_text_end != (char *)0x0 && (long)in_text_end - (long)in_text < 3) {
      return 1;
    }
    bVar1 = *in_text;
    if (bVar1 == 0xed) {
LAB_00176296:
      if (0x9f < (byte)in_text[1]) {
        return 3;
      }
    }
    else if (bVar1 == 0xe0) {
      if ((byte)(in_text[1] + 0x40U) < 0xe0) {
        return 3;
      }
      if (bVar1 == 0xed) goto LAB_00176296;
    }
    iVar2 = 3;
    if ((in_text[1] & 0xc0U) != 0x80) {
      return 3;
    }
    uVar4 = (uint)(byte)in_text[2];
    if ((in_text[2] & 0xc0U) != 0x80) {
      return 3;
    }
    uVar3 = ((byte)in_text[1] & 0x3f) << 6 | (bVar1 & 0xf) << 0xc;
  }
  else {
    iVar2 = 0;
    uVar3 = 0;
    if ((bVar1 & 0xf8) != 0xf0) goto LAB_001761d8;
    *out_char = 0xfffd;
    if (in_text_end != (char *)0x0 && (long)in_text_end - (long)in_text < 4) {
      return 1;
    }
    bVar1 = *in_text;
    iVar2 = 4;
    if (0xf4 < bVar1) {
      return 4;
    }
    if (bVar1 == 0xf4) {
LAB_00176360:
      if (0x8f < (byte)in_text[1]) {
        return 4;
      }
    }
    else if (bVar1 == 0xf0) {
      if ((byte)(in_text[1] + 0x40U) < 0xd0) {
        return 4;
      }
      if (bVar1 == 0xf4) goto LAB_00176360;
    }
    if ((in_text[1] & 0xc0U) != 0x80) {
      return 4;
    }
    if ((in_text[2] & 0xc0U) != 0x80) {
      return 4;
    }
    uVar4 = (uint)(byte)in_text[3];
    if ((uVar4 & 0xffffffc0) != 0x80) {
      return 4;
    }
    uVar6 = ((byte)in_text[1] & 0x3f) << 0xc | (bVar1 & 7) << 0x12;
    uVar5 = ((byte)in_text[2] & 0x3f) << 6;
    uVar3 = uVar5 | uVar6;
    if ((uVar5 & 0x1ff800 | uVar6) == 0xd800) {
      return 4;
    }
  }
  uVar3 = uVar4 & 0x3f | uVar3;
LAB_001761d8:
  *out_char = uVar3;
  return iVar2;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    unsigned int c = (unsigned int)-1;
    const unsigned char* str = (const unsigned char*)in_text;
    if (!(*str & 0x80))
    {
        c = (unsigned int)(*str++);
        *out_char = c;
        return 1;
    }
    if ((*str & 0xe0) == 0xc0)
    {
        *out_char = 0xFFFD; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 2) return 1;
        if (*str < 0xc2) return 2;
        c = (unsigned int)((*str++ & 0x1f) << 6);
        if ((*str & 0xc0) != 0x80) return 2;
        c += (*str++ & 0x3f);
        *out_char = c;
        return 2;
    }
    if ((*str & 0xf0) == 0xe0)
    {
        *out_char = 0xFFFD; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 3) return 1;
        if (*str == 0xe0 && (str[1] < 0xa0 || str[1] > 0xbf)) return 3;
        if (*str == 0xed && str[1] > 0x9f) return 3; // str[1] < 0x80 is checked below
        c = (unsigned int)((*str++ & 0x0f) << 12);
        if ((*str & 0xc0) != 0x80) return 3;
        c += (unsigned int)((*str++ & 0x3f) << 6);
        if ((*str & 0xc0) != 0x80) return 3;
        c += (*str++ & 0x3f);
        *out_char = c;
        return 3;
    }
    if ((*str & 0xf8) == 0xf0)
    {
        *out_char = 0xFFFD; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 4) return 1;
        if (*str > 0xf4) return 4;
        if (*str == 0xf0 && (str[1] < 0x90 || str[1] > 0xbf)) return 4;
        if (*str == 0xf4 && str[1] > 0x8f) return 4; // str[1] < 0x80 is checked below
        c = (unsigned int)((*str++ & 0x07) << 18);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (unsigned int)((*str++ & 0x3f) << 12);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (unsigned int)((*str++ & 0x3f) << 6);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (*str++ & 0x3f);
        // utf-8 encodings of values used in surrogate pairs are invalid
        if ((c & 0xFFFFF800) == 0xD800) return 4;
        *out_char = c;
        return 4;
    }
    *out_char = 0;
    return 0;
}